

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

QStyleOptionMenuItem * __thiscall
QComboMenuDelegate::getStyleOption
          (QStyleOptionMenuItem *__return_storage_ptr__,QComboMenuDelegate *this,
          QStyleOptionViewItem *option,QModelIndex *index)

{
  QPalette *this_00;
  State *pSVar1;
  byte *pbVar2;
  undefined4 uVar3;
  QAbstractItemModel *pQVar4;
  Data *pDVar5;
  QWidgetData *pQVar6;
  undefined8 uVar7;
  uint uVar8;
  Representation RVar9;
  Representation RVar10;
  Representation RVar11;
  bool bVar12;
  char cVar13;
  int iVar14;
  QWidget *this_01;
  ulong uVar15;
  QString *pQVar16;
  QByteArray *pQVar17;
  long in_FS_OFFSET;
  QColor QVar18;
  QFont local_100 [16];
  undefined8 local_f0;
  undefined4 local_e8;
  QArrayDataPointer<char16_t> local_e0;
  undefined1 local_c8 [16];
  anon_union_24_3_e3d07ef4_for_data local_b8;
  undefined1 *puStack_a0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined1 *puStack_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(__return_storage_ptr__,0xaa,0x98);
  QStyleOptionMenuItem::QStyleOptionMenuItem(__return_storage_ptr__);
  local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::palette((QApplication *)&local_58,"QMenu");
  QPalette::resolve((QPalette *)local_c8);
  QPalette::~QPalette((QPalette *)&local_58);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_58,index,9);
  bVar12 = ::QVariant::canConvert<QBrush>((QVariant *)&local_58);
  if (bVar12) {
    qvariant_cast<QBrush>((QVariant *)&local_78);
    QPalette::setBrush((QPalette *)local_c8,WindowText,(QBrush *)local_78.data);
    QBrush::~QBrush((QBrush *)local_78.data);
    qvariant_cast<QBrush>((QVariant *)&local_78);
    QPalette::setBrush((QPalette *)local_c8,ButtonText,(QBrush *)local_78.data);
    QBrush::~QBrush((QBrush *)local_78.data);
    qvariant_cast<QBrush>((QVariant *)&local_78);
    QPalette::setBrush((QPalette *)local_c8,Text,(QBrush *)local_78.data);
    QBrush::~QBrush((QBrush *)local_78.data);
  }
  this_00 = &(__return_storage_ptr__->super_QStyleOption).palette;
  QPalette::operator=(this_00,(QPalette *)local_c8);
  (__return_storage_ptr__->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>
  .super_QFlagsStorage<QStyle::StateFlag>.i = 0;
  this_01 = QWidget::window(&this->mCombo->super_QWidget);
  bVar12 = QWidget::isActiveWindow(this_01);
  if (bVar12) {
    (__return_storage_ptr__->super_QStyleOption).state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         0x10000;
  }
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 1) == 0) {
LAB_003ad14e:
    (__return_storage_ptr__->super_QStyleOption).palette.currentGroup = Disabled;
  }
  else {
    pQVar4 = (index->m).ptr;
    uVar15 = (**(code **)(*(long *)pQVar4 + 0x138))(pQVar4,index);
    if ((uVar15 & 0x20) == 0) goto LAB_003ad14e;
    pSVar1 = &(__return_storage_ptr__->super_QStyleOption).state;
    *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 1;
  }
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8000) != 0) {
    pbVar2 = (byte *)((long)&(__return_storage_ptr__->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar2 = *pbVar2 | 0x80;
  }
  __return_storage_ptr__->checkType = NonExclusive;
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_78,index,10);
  if (puStack_60 < (undefined1 *)0x4) {
    iVar14 = QComboBox::currentIndex(this->mCombo);
    __return_storage_ptr__->checked = iVar14 == index->r;
  }
  else {
    iVar14 = qvariant_cast<int>((QVariant *)&local_78);
    __return_storage_ptr__->checked = iVar14 == 2;
    iVar14 = qvariant_cast<int>((QVariant *)&local_78);
    uVar8 = 0x20;
    if (iVar14 != 2) {
      uVar8 = 8;
    }
    pSVar1 = &(__return_storage_ptr__->super_QStyleOption).state;
    (pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).super_QFlagsStorage<QStyle::StateFlag>
    .i = (pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
         super_QFlagsStorage<QStyle::StateFlag>.i | uVar8;
  }
  bVar12 = QComboBoxDelegate::isSeparator(index);
  __return_storage_ptr__->menuItemType = (uint)bVar12 * 2;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_98,index,1);
  iVar14 = ::QVariant::typeId((QVariant *)&local_98);
  if (iVar14 == 0x1003) {
    if (getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap == '\0') {
      iVar14 = __cxa_guard_acquire(&getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::
                                    pixmap);
      if (iVar14 != 0) {
        QPixmap::QPixmap((QPixmap *)
                         getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap,
                         &option->decorationSize);
        __cxa_atexit(QPixmap::~QPixmap,
                     getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap,0x7fe000
                    );
        __cxa_guard_release(&getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap)
        ;
      }
    }
    QVar18 = qvariant_cast<QColor>((QVariant *)&local_98);
    local_b8.shared = (PrivateShared *)QVar18._0_8_;
    local_b8._8_6_ = QVar18.ct._4_6_;
    QPixmap::fill((QColor *)getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap);
    QIcon::QIcon((QIcon *)&local_b8.shared,
                 (QPixmap *)getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap);
    QIcon::operator=(&__return_storage_ptr__->icon,(QIcon *)&local_b8.shared);
LAB_003ad2a4:
    QIcon::~QIcon((QIcon *)&local_b8.shared);
  }
  else {
    if (iVar14 == 0x1005) {
      qvariant_cast<QIcon>((QVariant *)&local_b8);
      QIcon::operator=(&__return_storage_ptr__->icon,(QIcon *)&local_b8.shared);
      goto LAB_003ad2a4;
    }
    qvariant_cast<QPixmap>((QVariant *)&local_b8);
    QIcon::QIcon((QIcon *)&local_e0,(QPixmap *)local_b8.data);
    QIcon::operator=(&__return_storage_ptr__->icon,(QIcon *)&local_e0);
    QIcon::~QIcon((QIcon *)&local_e0);
    QPixmap::~QPixmap((QPixmap *)local_b8.data);
  }
  QModelIndex::data((QVariant *)&local_b8,index,8);
  bVar12 = ::QVariant::canConvert<QBrush>((QVariant *)&local_b8);
  ::QVariant::~QVariant((QVariant *)&local_b8);
  if (bVar12) {
    QModelIndex::data((QVariant *)&local_b8,index,8);
    qvariant_cast<QBrush>((QVariant *)&local_e0);
    QPalette::setBrush((ColorGroup)this_00,Mid,(QBrush *)0xa);
    QBrush::~QBrush((QBrush *)&local_e0);
    ::QVariant::~QVariant((QVariant *)&local_b8);
  }
  QModelIndex::data((QVariant *)&local_b8,index,0);
  ::QVariant::toString();
  pQVar16 = (QString *)QString::replace((QChar)(char16_t)&local_e0,(QLatin1String *)0x26,2);
  QString::operator=(&__return_storage_ptr__->text,pQVar16);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  ::QVariant::~QVariant((QVariant *)&local_b8);
  __return_storage_ptr__->reservedShortcutWidth = 0;
  __return_storage_ptr__->maxIconWidth = (option->decorationSize).wd.m_i + 4;
  RVar9.m_i = (option->super_QStyleOption).rect.y1.m_i;
  RVar10.m_i = (option->super_QStyleOption).rect.x2.m_i;
  RVar11.m_i = (option->super_QStyleOption).rect.y2.m_i;
  (__return_storage_ptr__->menuRect).x1 = (Representation)(option->super_QStyleOption).rect.x1.m_i;
  (__return_storage_ptr__->menuRect).y1 = (Representation)RVar9.m_i;
  (__return_storage_ptr__->menuRect).x2 = (Representation)RVar10.m_i;
  (__return_storage_ptr__->menuRect).y2 = (Representation)RVar11.m_i;
  RVar9.m_i = (option->super_QStyleOption).rect.y1.m_i;
  RVar10.m_i = (option->super_QStyleOption).rect.x2.m_i;
  RVar11.m_i = (option->super_QStyleOption).rect.y2.m_i;
  (__return_storage_ptr__->super_QStyleOption).rect.x1 =
       (Representation)(option->super_QStyleOption).rect.x1.m_i;
  (__return_storage_ptr__->super_QStyleOption).rect.y1 = (Representation)RVar9.m_i;
  (__return_storage_ptr__->super_QStyleOption).rect.x2 = (Representation)RVar10.m_i;
  (__return_storage_ptr__->super_QStyleOption).rect.y2 = (Representation)RVar11.m_i;
  local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_b8,index,6);
  if (puStack_a0 < (undefined1 *)0x4) {
    bVar12 = QWidget::testAttribute_helper(&this->mCombo->super_QWidget,WA_SetFont);
    if (!bVar12) {
      bVar12 = QWidget::testAttribute_helper(&this->mCombo->super_QWidget,WA_MacSmallSize);
      if (!bVar12) {
        bVar12 = QWidget::testAttribute_helper(&this->mCombo->super_QWidget,WA_MacMiniSize);
        if (!bVar12) {
          pQVar6 = (this->mCombo->super_QWidget).data;
          pQVar17 = (QByteArray *)qt_app_fonts_hash();
          QByteArray::QByteArray((QByteArray *)&local_e0,"QComboBox",-1);
          QFont::QFont(local_100);
          QHash<QByteArray,_QFont>::value
                    ((QHash<QByteArray,_QFont> *)&local_f0,pQVar17,(QFont *)&local_e0);
          cVar13 = QFont::operator!=(&pQVar6->fnt,(QFont *)&local_f0);
          QFont::~QFont((QFont *)&local_f0);
          QFont::~QFont(local_100);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_e0);
          if (cVar13 == '\0') {
            pQVar17 = (QByteArray *)qt_app_fonts_hash();
            QByteArray::QByteArray((QByteArray *)&local_e0,"QComboMenuItem",-1);
            QHash<QByteArray,_QFont>::value
                      ((QHash<QByteArray,_QFont> *)&local_f0,pQVar17,(QFont *)&local_e0);
            uVar7 = *(undefined8 *)&__return_storage_ptr__->font;
            *(undefined8 *)&__return_storage_ptr__->font = local_f0;
            uVar3 = *(undefined4 *)&__return_storage_ptr__->field_0x90;
            *(undefined4 *)&__return_storage_ptr__->field_0x90 = local_e8;
            local_f0 = uVar7;
            local_e8 = uVar3;
            QFont::~QFont((QFont *)&local_f0);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_e0);
            goto LAB_003ad51a;
          }
        }
      }
    }
    QFont::operator=(&__return_storage_ptr__->font,&((this->mCombo->super_QWidget).data)->fnt);
  }
  else {
    qvariant_cast<QFont>((QVariant *)&local_e0);
    pDVar5 = *(Data **)&__return_storage_ptr__->font;
    *(Data **)&__return_storage_ptr__->font = local_e0.d;
    uVar3 = *(undefined4 *)&__return_storage_ptr__->field_0x90;
    *(undefined4 *)&__return_storage_ptr__->field_0x90 = local_e0.ptr._0_4_;
    local_e0.d = pDVar5;
    local_e0.ptr._0_4_ = uVar3;
    QFont::~QFont((QFont *)&local_e0);
  }
LAB_003ad51a:
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_e0,&__return_storage_ptr__->font);
  pDVar5 = *(Data **)&(__return_storage_ptr__->super_QStyleOption).fontMetrics;
  *(Data **)&(__return_storage_ptr__->super_QStyleOption).fontMetrics = local_e0.d;
  local_e0.d = pDVar5;
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_e0);
  ::QVariant::~QVariant((QVariant *)&local_b8);
  ::QVariant::~QVariant((QVariant *)&local_98);
  ::QVariant::~QVariant((QVariant *)&local_78);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QPalette::~QPalette((QPalette *)local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStyleOptionMenuItem QComboMenuDelegate::getStyleOption(const QStyleOptionViewItem &option,
                                                        const QModelIndex &index) const
{
    QStyleOptionMenuItem menuOption;

    QPalette resolvedpalette = option.palette.resolve(QApplication::palette("QMenu"));
    QVariant value = index.data(Qt::ForegroundRole);
    if (value.canConvert<QBrush>()) {
        resolvedpalette.setBrush(QPalette::WindowText, qvariant_cast<QBrush>(value));
        resolvedpalette.setBrush(QPalette::ButtonText, qvariant_cast<QBrush>(value));
        resolvedpalette.setBrush(QPalette::Text, qvariant_cast<QBrush>(value));
    }
    menuOption.palette = resolvedpalette;
    menuOption.state = QStyle::State_None;
    if (mCombo->window()->isActiveWindow())
        menuOption.state = QStyle::State_Active;
    if ((option.state & QStyle::State_Enabled) && (index.model()->flags(index) & Qt::ItemIsEnabled))
        menuOption.state |= QStyle::State_Enabled;
    else
        menuOption.palette.setCurrentColorGroup(QPalette::Disabled);
    if (option.state & QStyle::State_Selected)
        menuOption.state |= QStyle::State_Selected;
    menuOption.checkType = QStyleOptionMenuItem::NonExclusive;
    // a valid checkstate means that the model has checkable items
    const QVariant checkState = index.data(Qt::CheckStateRole);
    if (!checkState.isValid()) {
        menuOption.checked = mCombo->currentIndex() == index.row();
    } else {
        menuOption.checked = qvariant_cast<int>(checkState) == Qt::Checked;
        menuOption.state |= qvariant_cast<int>(checkState) == Qt::Checked
                          ? QStyle::State_On : QStyle::State_Off;
    }
    if (QComboBoxDelegate::isSeparator(index))
        menuOption.menuItemType = QStyleOptionMenuItem::Separator;
    else
        menuOption.menuItemType = QStyleOptionMenuItem::Normal;

    const QVariant variant = index.data(Qt::DecorationRole);
    switch (variant.userType()) {
    case QMetaType::QIcon:
        menuOption.icon = qvariant_cast<QIcon>(variant);
        break;
    case QMetaType::QColor: {
        static QPixmap pixmap(option.decorationSize);
        pixmap.fill(qvariant_cast<QColor>(variant));
        menuOption.icon = pixmap;
        break; }
    default:
        menuOption.icon = qvariant_cast<QPixmap>(variant);
        break;
    }
    if (index.data(Qt::BackgroundRole).canConvert<QBrush>()) {
        menuOption.palette.setBrush(QPalette::All, QPalette::Window,
                                    qvariant_cast<QBrush>(index.data(Qt::BackgroundRole)));
    }
    menuOption.text = index.data(Qt::DisplayRole).toString().replace(u'&', "&&"_L1);
    menuOption.reservedShortcutWidth = 0;
    menuOption.maxIconWidth =  option.decorationSize.width() + 4;
    menuOption.menuRect = option.rect;
    menuOption.rect = option.rect;

    // Make sure fonts set on the model or on the combo box, in
    // that order, also override the font for the popup menu.
    QVariant fontRoleData = index.data(Qt::FontRole);
    if (fontRoleData.isValid()) {
        menuOption.font = qvariant_cast<QFont>(fontRoleData);
    } else if (mCombo->testAttribute(Qt::WA_SetFont)
            || mCombo->testAttribute(Qt::WA_MacSmallSize)
            || mCombo->testAttribute(Qt::WA_MacMiniSize)
            || mCombo->font() != qt_app_fonts_hash()->value("QComboBox", QFont())) {
        menuOption.font = mCombo->font();
    } else {
        menuOption.font = qt_app_fonts_hash()->value("QComboMenuItem", mCombo->font());
    }

    menuOption.fontMetrics = QFontMetrics(menuOption.font);

    return menuOption;
}